

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

int SUNLogger_Flush(SUNLogger logger,SUNLogLevel lvl)

{
  int retval;
  SUNLogLevel lvl_local;
  SUNLogger logger_local;
  undefined4 local_4;
  
  if (logger == (SUNLogger)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNLogger_Flush(SUNLogger logger, SUNLogLevel lvl)
{
  int retval = 0;

  if (logger == NULL)
  {
    return -1;
  }

#if SUNDIALS_LOGGING_LEVEL > 0
  if (logger->flush)
  {
    retval = logger->flush(logger, lvl);
  }
  else
  {
    /* Default implementation */
    if (sunLoggerIsOutputRank(logger, NULL))
    {
      switch (lvl)
      {
      case (SUN_LOGLEVEL_DEBUG):
        if (logger->debug_fp)
        {
          fflush(logger->debug_fp);
        }
        break;
      case (SUN_LOGLEVEL_WARNING):
        if (logger->warning_fp)
        {
          fflush(logger->warning_fp);
        }
        break;
      case (SUN_LOGLEVEL_INFO):
        if (logger->info_fp)
        {
          fflush(logger->info_fp);
        }
        break;
      case (SUN_LOGLEVEL_ERROR):
        if (logger->error_fp)
        {
          fflush(logger->error_fp);
        }
        break;
      case (SUN_LOGLEVEL_ALL):
        if (logger->debug_fp)
        {
          fflush(logger->debug_fp);
        }
        if (logger->warning_fp)
        {
          fflush(logger->warning_fp);
        }
        if (logger->info_fp)
        {
          fflush(logger->info_fp);
        }
        if (logger->error_fp)
        {
          fflush(logger->error_fp);
        }
        break;
      default:
        retval = -1;
      }
    }
  }
#endif

  return retval;
}